

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::printCurrentTestStarted(JUnitTestOutput *this,UtestShell *test)

{
  uint uVar1;
  size_t sVar2;
  JUnitTestCaseResultNode *pJVar3;
  undefined1 local_58 [16];
  undefined1 local_48 [32];
  UtestShell *local_18;
  UtestShell *test_local;
  JUnitTestOutput *this_local;
  
  (this->impl_->results_).testCount_ = (this->impl_->results_).testCount_ + 1;
  local_18 = test;
  test_local = (UtestShell *)this;
  UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffd8);
  SimpleString::operator=(&(this->impl_->results_).group_,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  sVar2 = (*GetPlatformSpecificTimeInMillis)();
  (this->impl_->results_).startTime_ = sVar2;
  if ((this->impl_->results_).tail_ == (JUnitTestCaseResultNode *)0x0) {
    pJVar3 = (JUnitTestCaseResultNode *)
             operator_new(0x50,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                          ,0x88);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(pJVar3);
    (this->impl_->results_).tail_ = pJVar3;
    (this->impl_->results_).head_ = pJVar3;
  }
  else {
    pJVar3 = (JUnitTestCaseResultNode *)
             operator_new(0x50,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                          ,0x8b);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(pJVar3);
    ((this->impl_->results_).tail_)->next_ = pJVar3;
    (this->impl_->results_).tail_ = ((this->impl_->results_).tail_)->next_;
  }
  UtestShell::getName((UtestShell *)local_48);
  SimpleString::operator=(&((this->impl_->results_).tail_)->name_,(SimpleString *)local_48);
  SimpleString::~SimpleString((SimpleString *)local_48);
  UtestShell::getFile((UtestShell *)local_58);
  SimpleString::operator=(&((this->impl_->results_).tail_)->file_,(SimpleString *)local_58);
  SimpleString::~SimpleString((SimpleString *)local_58);
  sVar2 = UtestShell::getLineNumber(local_18);
  ((this->impl_->results_).tail_)->lineNumber_ = sVar2;
  uVar1 = (*local_18->_vptr_UtestShell[6])();
  if ((uVar1 & 1) == 0) {
    ((this->impl_->results_).tail_)->ignored_ = true;
  }
  return;
}

Assistant:

void JUnitTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    impl_->results_.testCount_++;
    impl_->results_.group_ = test.getGroup();
    impl_->results_.startTime_ = (size_t) GetPlatformSpecificTimeInMillis();

    if (impl_->results_.tail_ == NULLPTR) {
        impl_->results_.head_ = impl_->results_.tail_
                = new JUnitTestCaseResultNode;
    }
    else {
        impl_->results_.tail_->next_ = new JUnitTestCaseResultNode;
        impl_->results_.tail_ = impl_->results_.tail_->next_;
    }
    impl_->results_.tail_->name_ = test.getName();
    impl_->results_.tail_->file_ = test.getFile();
    impl_->results_.tail_->lineNumber_ = test.getLineNumber();
    if (!test.willRun()) {
        impl_->results_.tail_->ignored_ = true;
    }
}